

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_datanode.c
# Opt level: O3

SUNErrCode SUNDataNode_IsList(SUNDataNode self,int *yes_or_no)

{
  _func_SUNErrCode_SUNDataNode_int_ptr *UNRECOVERED_JUMPTABLE;
  SUNErrCode SVar1;
  
  UNRECOVERED_JUMPTABLE = self->ops->islist;
  if (UNRECOVERED_JUMPTABLE != (_func_SUNErrCode_SUNDataNode_int_ptr *)0x0) {
    SVar1 = (*UNRECOVERED_JUMPTABLE)(self,yes_or_no);
    return SVar1;
  }
  return -0x2701;
}

Assistant:

SUNErrCode SUNDataNode_IsList(const SUNDataNode self, sunbooleantype* yes_or_no)
{
  SUNFunctionBegin(self->sunctx);

  SUNDIALS_MARK_FUNCTION_BEGIN(SUNCTX_->profiler);

  if (self->ops->islist)
  {
    SUNErrCode err = self->ops->islist(self, yes_or_no);
    SUNDIALS_MARK_FUNCTION_END(SUNCTX_->profiler);
    return err;
  }

  SUNDIALS_MARK_FUNCTION_END(SUNCTX_->profiler);
  return SUN_ERR_NOT_IMPLEMENTED;
}